

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.h
# Opt level: O0

void __thiscall
rest_rpc::rpc_service::msgpack_codec::unpack<std::tuple<>>
          (msgpack_codec *this,char *data,size_t length)

{
  void *in_RDX;
  unpack_limit *in_RSI;
  object_handle *in_RDI;
  object *this_00;
  unpack_reference_func in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  object_handle *in_stack_ffffffffffffffc0;
  
  this_00 = (object *)0xffffffff;
  msgpack::v1::unpack_limit::unpack_limit
            ((unpack_limit *)&stack0xffffffffffffffb8,0xffffffff,0xffffffff,0xffffffff,0xffffffff,
             0xffffffff,0xffffffff);
  msgpack::v3::unpack(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                      in_stack_ffffffffffffffa8,in_RDX,in_RSI);
  msgpack::v1::object_handle::get(in_RDI);
  msgpack::v1::object::as<std::tuple<>>(this_00);
  return;
}

Assistant:

T unpack(char const *data, size_t length) {
    try {
      msgpack::unpack(msg_, data, length);
      return msg_.get().as<T>();
    } catch (...) {
      throw std::invalid_argument("unpack failed: Args not match!");
    }
  }